

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::SchemaElementDecl> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  SchemaElementDecl *t;
  SchemaElementDecl *serObj;
  SchemaElementDecl *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (SchemaElementDecl *)
        BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (SchemaElementDecl *)0x0; data < t;
        data = (SchemaElementDecl *)
               ((long)&(data->super_XMLElementDecl).super_XSerializable._vptr_XSerializable + 1)) {
      serObj = BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::elementAt
                         (&objToStore->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,
                          (XMLSize_t)data);
      operator<<(serEng,(XSerializable *)serObj);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<SchemaElementDecl>* const objToStore
                                    , XSerializeEngine&                     serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {

        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            SchemaElementDecl* data = objToStore->elementAt(i);
            serEng<<data;
        }

    }

}